

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

Result __thiscall
spectest::CommandRunner::OnActionCommand(CommandRunner *this,ActionCommand *command)

{
  uint32_t line_number;
  pointer pcVar1;
  Enum EVar2;
  ActionResult result;
  ActionResult local_88;
  long *local_40 [2];
  long local_30 [2];
  
  RunAction(&local_88,this,(command->super_CommandMixin<(wabt::CommandType)2>).super_Command.line,
            &command->action,Verbose);
  if (local_88.trap.obj_ == (Trap *)0x0) {
    EVar2 = Ok;
  }
  else {
    line_number = (command->super_CommandMixin<(wabt::CommandType)2>).super_Command.line;
    pcVar1 = ((local_88.trap.obj_)->message_)._M_dataplus._M_p;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,pcVar1,pcVar1 + ((local_88.trap.obj_)->message_)._M_string_length)
    ;
    PrintError(this,line_number,"unexpected trap: %s",local_40[0]);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    EVar2 = Error;
  }
  if (local_88.trap.obj_ != (Trap *)0x0) {
    wabt::interp::Store::DeleteRoot(local_88.trap.store_,local_88.trap.root_index_);
    local_88.trap.obj_ = (Trap *)0x0;
    local_88.trap.store_ = (Store *)0x0;
    local_88.trap.root_index_ = 0;
  }
  if (local_88.values.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.values.
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.values.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.values.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (Result)EVar2;
}

Assistant:

wabt::Result CommandRunner::OnActionCommand(const ActionCommand* command) {
  ActionResult result =
      RunAction(command->line, &command->action, RunVerbosity::Verbose);

  if (result.trap) {
    PrintError(command->line, "unexpected trap: %s",
               result.trap->message().c_str());
    return wabt::Result::Error;
  }

  return wabt::Result::Ok;
}